

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O2

size_t __thiscall
SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetBufferedLength
          (BacktrackingTokenStream<SGParser::Generator::RegExprParseToken> *this,size_t markerIndex)

{
  const_iterator cVar1;
  size_t sVar2;
  size_t local_20;
  size_t markerIndex_local;
  
  local_20 = markerIndex;
  cVar1 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*>,_std::_Select1st<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::StreamBlock_*>_>_>
          ::find(&(this->Markers)._M_t,&local_20);
  sVar2 = 0;
  if ((_Rb_tree_header *)cVar1._M_node != &(this->Markers)._M_t._M_impl.super__Rb_tree_header) {
    sVar2 = this->Pos - local_20;
  }
  return sVar2;
}

Assistant:

size_t BacktrackingTokenStream<Token>::GetBufferedLength(size_t markerIndex) const {
    // If not found, we fail
    if (Markers.find(markerIndex) == Markers.end())
        return 0u;
    return Pos - markerIndex;
}